

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testCreateHeartbeat(int count)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Heartbeat HStack_178;
  
  lVar1 = GetTickCount();
  iVar3 = 0;
  if (0 < count) {
    iVar3 = count;
  }
  while (iVar3 != 0) {
    FIX42::Heartbeat::Heartbeat(&HStack_178);
    FIX::Message::~Message((Message *)&HStack_178);
    iVar3 = iVar3 + -1;
  }
  lVar2 = GetTickCount();
  return lVar2 - lVar1;
}

Assistant:

long testCreateHeartbeat(int count) {
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX42::Heartbeat();
  }

  return GetTickCount() - start;
}